

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_ed5eae::SignalHandlerGuard::SignalHandlerGuard
          (SignalHandlerGuard *this,char *name)

{
  (anonymous_namespace)::LastName = (SignalHandlerGuard *)0x66a836;
  if (this != (SignalHandlerGuard *)0x0) {
    (anonymous_namespace)::LastName = this;
  }
  signal(0xb,TrapsForSignals);
  signal(7,TrapsForSignals);
  signal(4,TrapsForSignals);
  return;
}

Assistant:

explicit SignalHandlerGuard(const char* name)
  {
    LastName = name != nullptr ? name : "????";

    signal(SIGSEGV, TrapsForSignals);
#ifdef SIGBUS
    signal(SIGBUS, TrapsForSignals);
#endif
    signal(SIGILL, TrapsForSignals);
  }